

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

bool __thiscall
dxil_spv::CFGStructurizer::control_flow_is_escaping_from_loop
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  CFGNode *other;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  CFGNode *this_00;
  pointer ppCVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  if (node != merge) {
    bVar6 = CFGNode::post_dominates(merge,node);
    if (!bVar6) {
      __assert_fail("merge->post_dominates(node)",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0xbc5,
                    "bool dxil_spv::CFGStructurizer::control_flow_is_escaping_from_loop(const CFGNode *, const CFGNode *) const"
                   );
    }
    this_00 = get_innermost_loop_header_for(this,this->entry_block,node);
    if ((this_00 != (CFGNode *)0x0) && (this_00->pred_back_edge != (CFGNode *)0x0)) {
      bVar6 = CFGNode::dominates(node,merge);
      bVar8 = 1;
      bVar10 = true;
      bVar11 = true;
      if (this_00->pred_back_edge != node) {
        uVar1 = node->forward_post_visit_order;
        puVar3 = (this->reachability_bitset).
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = this_00->pred_back_edge->forward_post_visit_order;
        bVar10 = (puVar3[(ulong)(this->reachability_stride * uVar1) + (ulong)(uVar2 >> 5)] >>
                  (uVar2 & 0x1f) & 1) != 0;
        bVar11 = (puVar3[(ulong)(this->reachability_stride * uVar2) + (ulong)(uVar1 >> 5)] >>
                  (uVar1 & 0x1f) & 1) != 0;
      }
      ppCVar4 = (node->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar5 = (node->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar4 != ppCVar5) {
        do {
          ppCVar9 = ppCVar4 + 1;
          other = *ppCVar4;
          bVar7 = CFGNode::dominates(this_00,other);
          if (other == this_00->pred_back_edge) {
            bVar12 = false;
          }
          else {
            uVar1 = this_00->pred_back_edge->forward_post_visit_order;
            bVar12 = ((this->reachability_bitset).
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(ulong)(this->reachability_stride * other->forward_post_visit_order) +
                       (ulong)(uVar1 >> 5)] >> (uVar1 & 0x1f) & 1) == 0;
          }
        } while (((!bVar7 | bVar12) == 0) && (ppCVar4 = ppCVar9, ppCVar9 != ppCVar5));
        bVar8 = (!bVar7 | bVar12) ^ 1;
      }
      return (bool)(((bVar10 | bVar6 | bVar11) ^ 1U) & bVar8);
    }
  }
  return false;
}

Assistant:

bool CFGStructurizer::control_flow_is_escaping_from_loop(const CFGNode *node, const CFGNode *merge) const
{
	bool escaping_path = false;

	if (node == merge)
		return escaping_path;

	assert(merge->post_dominates(node));

	// First, test the loop scenario.
	// If we're inside a loop, we're a break construct if we can prove that:
	// - node has a loop header which dominates it.
	// - node cannot reach the continue block.
	// - Continue block cannot reach node.
	// - All post-domination frontiers can reach the continue block, meaning that at some point control flow
	//   decided to break out of the loop construct.
	auto *innermost_loop_header = get_innermost_loop_header_for(node);
	if (innermost_loop_header && innermost_loop_header->pred_back_edge)
	{
		bool dominates_merge = node->dominates(merge);
		bool can_reach_continue = query_reachability(*node, *innermost_loop_header->pred_back_edge);
		bool continue_can_reach = query_reachability(*innermost_loop_header->pred_back_edge, *node);
		bool pdf_can_reach_continue = true;

		for (auto *frontier : node->post_dominance_frontier)
		{
			bool header_dominates_frontier = innermost_loop_header->dominates(frontier);
			bool frontier_is_inside_loop_construct =
				query_reachability(*frontier, *innermost_loop_header->pred_back_edge);
			if (!header_dominates_frontier || !frontier_is_inside_loop_construct)
			{
				pdf_can_reach_continue = false;
				break;
			}
		}

		if (!dominates_merge && !continue_can_reach && !can_reach_continue && pdf_can_reach_continue)
			escaping_path = true;
	}

	return escaping_path;
}